

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfocusframe.cpp
# Opt level: O0

void __thiscall QFocusFrame::paintEvent(QFocusFrame *this,QPaintEvent *param_2)

{
  QFocusFramePrivate *this_00;
  QStyle *pQVar1;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QRect QVar2;
  QWidgetPrivate *wd;
  int hmargin;
  int vmargin;
  QFocusFramePrivate *d;
  QRect rect;
  QStylePainter p;
  QStyleOption option;
  undefined4 in_stack_ffffffffffffff48;
  ControlElement in_stack_ffffffffffffff4c;
  QWidget *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  QStyleOption *pQVar3;
  QWidgetPrivate *in_stack_ffffffffffffff80;
  undefined1 local_70 [16];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = d_func((QFocusFrame *)0x49ccc5);
  if (this_00->widget != (QWidget *)0x0) {
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter
              ((QStylePainter *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              ((QStyleOption *)this_00,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,local_48);
    pQVar1 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                           );
    (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x40,local_48,in_RDI);
    pQVar1 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                           );
    (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x41,local_48,in_RDI);
    qt_widget_private((QWidget *)0x49cdac);
    local_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QVar2 = QWidgetPrivate::clipRect(in_stack_ffffffffffffff80);
    local_70 = (undefined1  [16])
               QRect::adjusted(QVar2._8_8_,QVar2.y1.m_i.m_i,QVar2.x1.m_i.m_i,
                               (int)((ulong)pQVar3 >> 0x20),(int)pQVar3);
    QPainter::setClipRect((QRect *)&local_60,(ClipOperation)local_70);
    QStylePainter::drawControl
              ((QStylePainter *)in_RDI,in_stack_ffffffffffffff4c,(QStyleOption *)0x49ce2b);
    QStyleOption::~QStyleOption(in_RDI);
    QStylePainter::~QStylePainter((QStylePainter *)0x49ce3f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
QFocusFrame::paintEvent(QPaintEvent *)
{
    Q_D(QFocusFrame);

    if (!d->widget)
        return;

    QStylePainter p(this);
    QStyleOption option;
    initStyleOption(&option);
    const int vmargin = style()->pixelMetric(QStyle::PM_FocusFrameVMargin, &option, this);
    const int hmargin = style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &option, this);
    QWidgetPrivate *wd = qt_widget_private(d->widget);
    QRect rect = wd->clipRect().adjusted(0, 0, hmargin*2, vmargin*2);
    p.setClipRect(rect);
    p.drawControl(QStyle::CE_FocusFrame, option);
}